

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_move_val_anchor_to_key_anchor(Parser *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  code *pcVar5;
  bool bVar6;
  csubstr fmt;
  
  pcVar1 = (this->m_val_anchor).str;
  sVar2 = (this->m_val_anchor).len;
  if (pcVar1 != (char *)0x0 && sVar2 != 0) {
    sVar3 = (this->m_state->line_contents).full.len;
    if ((sVar3 != 0) &&
       (pcVar4 = (this->m_state->line_contents).full.str,
       pcVar1 + sVar2 <= pcVar4 + sVar3 && pcVar4 <= pcVar1)) {
      if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar5 = (code *)swi(3);
            (*pcVar5)();
            return;
          }
        }
        fmt.len = 0x1c;
        fmt.str = "ERROR: triple-pending anchor";
        _err<>(this,fmt);
      }
      sVar2 = (this->m_val_anchor).len;
      (this->m_key_anchor).str = (this->m_val_anchor).str;
      (this->m_key_anchor).len = sVar2;
      this->m_key_anchor_indentation = this->m_val_anchor_indentation;
      this->m_val_anchor_indentation = 0;
      (this->m_val_anchor).str = (char *)0x0;
      (this->m_val_anchor).len = 0;
    }
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }